

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlIconvWrapper(iconv_t cd,uchar *out,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *icv_out;
  char *icv_in;
  size_t icv_outlen;
  size_t icv_inlen;
  uchar *local_40;
  uchar *local_38;
  size_t local_30;
  size_t local_28;
  
  if ((((outlen == (int *)0x0) || (in == (uchar *)0x0)) || (out == (uchar *)0x0)) ||
     (inlen == (int *)0x0)) {
    iVar1 = -1;
    if (outlen != (int *)0x0) {
      *outlen = 0;
    }
  }
  else {
    local_28 = (size_t)*inlen;
    local_30 = (size_t)*outlen;
    local_40 = out;
    local_38 = in;
    sVar2 = iconv(cd,(char **)&local_38,&local_28,(char **)&local_40,&local_30);
    *inlen = *inlen - (int)local_28;
    *outlen = *outlen - (int)local_30;
    if ((local_28 != 0) || (iVar1 = 0, (int)sVar2 == -1)) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (iVar1 == 0x54) {
        iVar1 = -2;
      }
      else if ((iVar1 == 0x16) || (iVar1 != 7)) {
        iVar1 = -3;
      }
      else {
        iVar1 = -1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
xmlIconvWrapper(iconv_t cd, unsigned char *out, int *outlen,
                const unsigned char *in, int *inlen) {
    size_t icv_inlen, icv_outlen;
    const char *icv_in = (const char *) in;
    char *icv_out = (char *) out;
    int ret;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL)) {
        if (outlen != NULL) *outlen = 0;
        return(-1);
    }
    icv_inlen = *inlen;
    icv_outlen = *outlen;
    ret = iconv(cd, (ICONV_CONST char **) &icv_in, &icv_inlen, &icv_out, &icv_outlen);
    *inlen -= icv_inlen;
    *outlen -= icv_outlen;
    if ((icv_inlen != 0) || (ret == -1)) {
#ifdef EILSEQ
        if (errno == EILSEQ) {
            return -2;
        } else
#endif
#ifdef E2BIG
        if (errno == E2BIG) {
            return -1;
        } else
#endif
#ifdef EINVAL
        if (errno == EINVAL) {
            return -3;
        } else
#endif
        {
            return -3;
        }
    }
    return 0;
}